

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger_manager.cpp
# Opt level: O1

void __thiscall EmmyDebuggerManager::EmmyDebuggerManager(EmmyDebuggerManager *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Rb_tree_header *p_Var3;
  undefined1 local_56;
  undefined1 local_55;
  undefined1 local_54;
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  (this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var1 = &(this->stateBreak).super___shared_ptr<HookStateBreak,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<HookStateBreak,std::allocator<HookStateBreak>>
            (p_Var1,(HookStateBreak **)this,(allocator<HookStateBreak> *)&local_56);
  (this->stateStepOver).super___shared_ptr<HookStateStepOver,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var2 = &(this->stateStepOver).super___shared_ptr<HookStateStepOver,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  local_38 = p_Var1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<HookStateStepOver,std::allocator<HookStateStepOver>>
            (p_Var2,(HookStateStepOver **)&this->stateStepOver,
             (allocator<HookStateStepOver> *)&local_55);
  (this->stateStepIn).super___shared_ptr<HookStateStepIn,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var1 = &(this->stateStepIn).super___shared_ptr<HookStateStepIn,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  local_40 = p_Var2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<HookStateStepIn,std::allocator<HookStateStepIn>>
            (p_Var1,(HookStateStepIn **)&this->stateStepIn,(allocator<HookStateStepIn> *)&local_54);
  (this->stateStepOut).super___shared_ptr<HookStateStepOut,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var2 = &(this->stateStepOut).super___shared_ptr<HookStateStepOut,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  local_48 = p_Var1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<HookStateStepOut,std::allocator<HookStateStepOut>>
            (p_Var2,(HookStateStepOut **)&this->stateStepOut,
             (allocator<HookStateStepOut> *)&local_53);
  (this->stateContinue).super___shared_ptr<HookStateContinue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_50 = p_Var2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<HookStateContinue,std::allocator<HookStateContinue>>
            (&(this->stateContinue).
              super___shared_ptr<HookStateContinue,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (HookStateContinue **)&this->stateContinue,(allocator<HookStateContinue> *)&local_52);
  (this->stateStop).super___shared_ptr<HookStateStop,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<HookStateStop,std::allocator<HookStateStop>>
            (&(this->stateStop).super___shared_ptr<HookStateStop,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(HookStateStop **)&this->stateStop,(allocator<HookStateStop> *)&local_51);
  (this->helperCode)._M_dataplus._M_p = (pointer)&(this->helperCode).field_2;
  (this->helperCode)._M_string_length = 0;
  (this->helperCode).field_2._M_local_buf[0] = '\0';
  (this->extNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->extNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ExtensionPoint::ExtensionPoint(&this->extension);
  *(undefined8 *)((long)&(this->debuggerMtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->debuggerMtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->debuggerMtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->debuggerMtx).super___mutex_base._M_mutex + 8) = 0;
  (this->debuggerMtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  p_Var3 = &(this->debuggers)._M_t._M_impl.super__Rb_tree_header;
  (this->debuggers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->debuggers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->debuggers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->debuggers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  p_Var3 = &(this->lineSet)._M_t._M_impl.super__Rb_tree_header;
  (this->lineSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->lineSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->debuggers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->breakDebuggerMtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->breakDebuggerMtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->breakDebuggerMtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->breakDebuggerMtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->breakDebuggerMtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->hitDebugger).super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->hitDebugger).super___shared_ptr<Debugger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->breakpointsMtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->breakpointsMtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->breakpointsMtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->breakpointsMtx).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->breakpointsMtx).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->breakpoints).
  super__Vector_base<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->breakpoints).
  super__Vector_base<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->breakpoints).
  super__Vector_base<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lineSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->lineSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->lineSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->isRunning)._M_base._M_i = false;
  return;
}

Assistant:

EmmyDebuggerManager::EmmyDebuggerManager()
	: stateBreak(std::make_shared<HookStateBreak>()),
      stateStepOver(std::make_shared<HookStateStepOver>()),
      stateStepIn(std::make_shared<HookStateStepIn>()),
      stateStepOut(std::make_shared<HookStateStepOut>()),
	  stateContinue(std::make_shared<HookStateContinue>()),
	  stateStop(std::make_shared<HookStateStop>()),

	  isRunning(false)
{
}